

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

bit_cost_t __thiscall
lzham::lzcompressor::state::get_lit_cost
          (state *this,search_accelerator *dict,uint dict_pos,uint lit_pred0,
          uint is_match_model_index)

{
  bit_cost_t bVar1;
  search_accelerator *in_RDI;
  uint in_R8D;
  uint lit_pred_1;
  uint delta_lit;
  uint rep_lit1;
  uint rep_lit0;
  uint lit_pred;
  uint lit_pred1;
  uint lit;
  bit_cost_t cost;
  int in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  bit_cost_t local_28;
  
  bVar1 = adaptive_bit_model::get_cost
                    ((adaptive_bit_model *)((long)&in_RDI->m_lookahead_pos + (ulong)in_R8D * 2),0);
  search_accelerator::operator[](in_RDI,in_stack_ffffffffffffffac);
  if (*(uint *)((long)&in_RDI->m_pLZBase + 4) < 7) {
    get_pred_char((state *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,
                  in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
    local_28 = raw_quasi_adaptive_huffman_data_model::get_cost
                         ((raw_quasi_adaptive_huffman_data_model *)in_RDI,in_stack_ffffffffffffffac)
    ;
  }
  else {
    search_accelerator::operator[](in_RDI,in_stack_ffffffffffffffac);
    search_accelerator::operator[](in_RDI,in_stack_ffffffffffffffac);
    local_28 = raw_quasi_adaptive_huffman_data_model::get_cost
                         ((raw_quasi_adaptive_huffman_data_model *)in_RDI,in_stack_ffffffffffffffac)
    ;
  }
  local_28 = local_28 + bVar1;
  return local_28;
}

Assistant:

bit_cost_t lzcompressor::state::get_lit_cost(const search_accelerator& dict, uint dict_pos, uint lit_pred0, uint is_match_model_index) const
   {
      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(0);

      const uint lit = dict[dict_pos];

      if (m_cur_state < CLZBase::cNumLitStates)
      {
         // literal
         const uint lit_pred1 = get_pred_char(dict, dict_pos, 2);

         uint lit_pred = (lit_pred0 >> (8 - CLZBase::cNumLitPredBits/2)) |
            (((lit_pred1 >> (8 - CLZBase::cNumLitPredBits/2)) << CLZBase::cNumLitPredBits/2));

         cost += m_lit_table[lit_pred].get_cost(lit);
      }
      else
      {
         // delta literal
         const uint rep_lit0 = dict[(dict_pos - m_match_hist[0]) & dict.m_max_dict_size_mask];
         const uint rep_lit1 = dict[(dict_pos - m_match_hist[0] - 1) & dict.m_max_dict_size_mask];

         uint delta_lit = rep_lit0 ^ lit;

         uint lit_pred = (rep_lit0 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) |
            ((rep_lit1 >> (8 - CLZBase::cNumDeltaLitPredBits/2)) << CLZBase::cNumDeltaLitPredBits/2);

         cost += m_delta_lit_table[lit_pred].get_cost(delta_lit);
      }

      return cost;
   }